

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateModuleTypeInformation(ExpressionTranslateContext *ctx)

{
  TypeBase *pTVar1;
  long lVar2;
  TypeBase *pTVar3;
  long lVar4;
  ExpressionContext *pEVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long *plVar13;
  long lVar14;
  bool bVar15;
  
  PrintIndentedLine(ctx,"// Register types");
  pEVar5 = ctx->ctx;
  if ((pEVar5->types).count != 0) {
    uVar10 = 0;
    do {
      pTVar1 = (pEVar5->types).data[uVar10];
      if (pTVar1->isGeneric == true) {
        PrintIndentedLine(ctx,"__nullcTR[%d] = 0; // generic type \'%.*s\'",uVar10 & 0xffffffff,
                          (ulong)(uint)(*(int *)&(pTVar1->name).end - (int)(pTVar1->name).begin));
      }
      else {
        PrintIndent(ctx);
        Print(ctx,"__nullcTR[%d] = __nullcRegisterType(",uVar10 & 0xffffffff);
        Print(ctx,"%uu, ",(ulong)pTVar1->nameHash);
        Print(ctx,"\"%.*s\", ",
              (ulong)(uint)(*(int *)&(pTVar1->name).end - (int)(pTVar1->name).begin));
        Print(ctx,"%lld, ",pTVar1->size);
        if ((pTVar1 == (TypeBase *)0x0) || (pTVar3 = pTVar1, pTVar1->typeID != 0x13)) {
          pTVar3 = (TypeBase *)0x0;
        }
        if (pTVar3 == (TypeBase *)0x0) {
          if ((pTVar1 == (TypeBase *)0x0) || (pTVar3 = pTVar1, pTVar1->typeID != 0x14)) {
            pTVar3 = (TypeBase *)0x0;
          }
          if (pTVar3 == (TypeBase *)0x0) {
            if ((pTVar1 == (TypeBase *)0x0) || (pTVar3 = pTVar1, pTVar1->typeID != 0x12)) {
              pTVar3 = (TypeBase *)0x0;
            }
            if (pTVar3 == (TypeBase *)0x0) {
              if ((pTVar1 == (TypeBase *)0x0) || (pTVar3 = pTVar1, pTVar1->typeID != 0x15)) {
                pTVar3 = (TypeBase *)0x0;
              }
              if (pTVar3 == (TypeBase *)0x0) {
                if ((pTVar1 == (TypeBase *)0x0) || (pTVar3 = pTVar1, pTVar1->typeID != 0x18)) {
                  pTVar3 = (TypeBase *)0x0;
                }
                if (pTVar3 != (TypeBase *)0x0) {
                  lVar2._0_4_ = pTVar3[1].typeID;
                  lVar2._4_4_ = pTVar3[1].nameHash;
                  uVar8 = 0;
                  uVar12 = 0;
                  if (lVar2 != 0) {
                    uVar12 = 0;
                    do {
                      plVar13 = (long *)(lVar2 + 8);
                      lVar2 = *(long *)(lVar2 + 0x18);
                      uVar12 = (ulong)((int)uVar12 +
                                      (uint)(**(char **)(*(long *)(*plVar13 + 0x28) + 0x40) != '$'))
                      ;
                    } while (lVar2 != 0);
                  }
                  if (pTVar3[2].unsizedArrayType != (TypeUnsizedArray *)0x0) {
                    uVar8 = (ulong)((pTVar3[2].unsizedArrayType)->super_TypeStruct).super_TypeBase.
                                   typeIndex;
                  }
                  Print(ctx,"__nullcTR[%d], ",uVar8);
                  Print(ctx,"%d, NULLC_CLASS, %d, ",uVar12,(ulong)pTVar3->alignment);
                  bVar15 = *(char *)((long)&pTVar3[3]._vptr_TypeBase + 2) == '\x01';
                  if (bVar15) {
                    Print(ctx,"NULLC_TYPE_FLAG_HAS_FINALIZER");
                  }
                  if (*(char *)&pTVar3[2].arrayTypes.tail == '\x01') {
                    pcVar9 = "";
                    if (bVar15) {
                      pcVar9 = " | ";
                    }
                    Print(ctx,"%sNULLC_TYPE_FLAG_IS_EXTENDABLE",pcVar9);
                    bVar15 = true;
                  }
                  if (*(char *)&pTVar3[3]._vptr_TypeBase == '\0') {
                    pcVar9 = "";
                    if (bVar15) {
                      pcVar9 = " | ";
                    }
                    Print(ctx,"%sNULLC_TYPE_FLAG_FORWARD_DECLARATION",pcVar9);
                    bVar15 = true;
                  }
                  if (!bVar15) {
                    Print(ctx,"0");
                  }
                  Print(ctx,");");
                  goto LAB_0015bed3;
                }
                if (((pTVar1 == (TypeBase *)0x0) || (0x19 < pTVar1->typeID)) ||
                   (pTVar3 = pTVar1, (0x3130000U >> (pTVar1->typeID & 0x1f) & 1) == 0)) {
                  pTVar3 = (TypeBase *)0x0;
                }
                if (pTVar3 != (TypeBase *)0x0) {
                  lVar4._0_4_ = pTVar3[1].typeID;
                  lVar4._4_4_ = pTVar3[1].nameHash;
                  uVar8 = 0;
                  for (; lVar4 != 0; lVar4 = *(long *)(lVar4 + 0x18)) {
                    uVar8 = (ulong)((int)uVar8 +
                                   (uint)(**(char **)(*(long *)(*(long *)(lVar4 + 8) + 0x28) + 0x40)
                                         != '$'));
                  }
                  Print(ctx,"__nullcTR[0], ");
                  uVar11 = pTVar3->alignment;
                  pcVar9 = "%d, NULLC_CLASS, %d, 0);";
                  goto LAB_0015be11;
                }
                Print(ctx,"__nullcTR[0], ");
                uVar8 = (ulong)pTVar1->alignment;
                pcVar9 = "0, NULLC_NONE, %d, 0);";
              }
              else {
                Print(ctx,"__nullcTR[%d], ",(ulong)*(uint *)(pTVar3[1]._vptr_TypeBase + 5));
                uVar8 = (ulong)pTVar3->alignment;
                pcVar9 = "0, NULLC_FUNCTION, %d, 0);";
              }
            }
            else {
              Print(ctx,"__nullcTR[%d], ",(ulong)*(uint *)(pTVar3[1]._vptr_TypeBase + 5));
              uVar8 = (ulong)pTVar3->alignment;
              pcVar9 = "1, NULLC_POINTER, %d, 0);";
            }
          }
          else {
            Print(ctx,"__nullcTR[%d], ",(ulong)*(uint *)(*(long *)&pTVar3[1].typeIndex + 0x28));
            uVar8 = (ulong)pTVar3->alignment;
            pcVar9 = "-1, NULLC_ARRAY, %d, 0);";
          }
          Print(ctx,pcVar9,uVar8);
        }
        else {
          Print(ctx,"__nullcTR[%d], ",(ulong)*(uint *)(pTVar3[1]._vptr_TypeBase + 5));
          uVar11 = pTVar3->alignment;
          uVar8 = (ulong)pTVar3[1].typeID;
          pcVar9 = "%d, NULLC_ARRAY, %d, 0);";
LAB_0015be11:
          Print(ctx,pcVar9,uVar8,(ulong)uVar11);
        }
LAB_0015bed3:
        OutputContext::Print(ctx->output,"\n",1);
      }
      uVar10 = uVar10 + 1;
      pEVar5 = ctx->ctx;
    } while (uVar10 < (pEVar5->types).count);
  }
  OutputContext::Print(ctx->output,"\n",1);
  PrintIndentedLine(ctx,"// Register type members");
  pEVar5 = ctx->ctx;
  if ((pEVar5->types).count != 0) {
    uVar10 = 0;
    do {
      pTVar1 = (pEVar5->types).data[uVar10];
      if (pTVar1->isGeneric == false) {
        if ((pTVar1 == (TypeBase *)0x0) || (pTVar3 = pTVar1, pTVar1->typeID != 0x15)) {
          pTVar3 = (TypeBase *)0x0;
        }
        if (pTVar3 == (TypeBase *)0x0) {
          if (((pTVar1 == (TypeBase *)0x0) || (0x19 < pTVar1->typeID)) ||
             (pTVar3 = pTVar1, (0x3130000U >> (pTVar1->typeID & 0x1f) & 1) == 0)) {
            pTVar3 = (TypeBase *)0x0;
          }
          if (pTVar3 == (TypeBase *)0x0) goto LAB_0015c322;
          lVar7._0_4_ = pTVar3[1].typeID;
          lVar7._4_4_ = pTVar3[1].nameHash;
          uVar11 = 0;
          for (; lVar7 != 0; lVar7 = *(long *)(lVar7 + 0x18)) {
            uVar11 = uVar11 + (**(char **)(*(long *)(*(long *)(lVar7 + 8) + 0x28) + 0x40) != '$');
          }
          PrintIndent(ctx);
          Print(ctx,"__nullcRegisterMembers(__nullcTR[%d], %d",uVar10 & 0xffffffff,(ulong)uVar11);
          lVar14._0_4_ = pTVar3[1].typeID;
          lVar14._4_4_ = pTVar3[1].nameHash;
          pcVar9 = "); // type \'%.*s\' members";
          if (lVar14 != 0) {
            do {
              if (**(char **)(*(long *)(*(long *)(lVar14 + 8) + 0x28) + 0x40) != '$') {
                Print(ctx,", __nullcTR[%d]",
                      (ulong)*(uint *)(*(long *)(*(long *)(lVar14 + 8) + 0x20) + 0x28));
                Print(ctx,", %d",(ulong)*(uint *)(*(long *)(lVar14 + 8) + 0x3c));
                lVar2 = *(long *)(*(long *)(lVar14 + 8) + 0x28);
                Print(ctx,", \"%.*s\"",
                      (ulong)(uint)(*(int *)(lVar2 + 0x48) - (int)*(undefined8 *)(lVar2 + 0x40)));
              }
              lVar14 = *(long *)(lVar14 + 0x18);
            } while (lVar14 != 0);
            pcVar9 = "); // type \'%.*s\' members";
          }
        }
        else {
          PrintIndent(ctx);
          lVar6._0_4_ = pTVar3[1].typeID;
          lVar6._4_4_ = pTVar3[1].nameHash;
          uVar8 = 0;
          for (; lVar6 != 0; lVar6 = *(long *)(lVar6 + 8)) {
            uVar8 = (ulong)((int)uVar8 + 1);
          }
          Print(ctx,"__nullcRegisterMembers(__nullcTR[%d], %d",uVar10 & 0xffffffff,uVar8);
          plVar13 = *(long **)&pTVar3[1].typeID;
          pcVar9 = "); // type \'%.*s\' arguments";
          if (plVar13 != (long *)0x0) {
            do {
              Print(ctx,", __nullcTR[%d]",(ulong)*(uint *)(*plVar13 + 0x28));
              Print(ctx,", 0");
              Print(ctx,", \"\"");
              plVar13 = (long *)plVar13[1];
            } while (plVar13 != (long *)0x0);
            pcVar9 = "); // type \'%.*s\' arguments";
          }
        }
        Print(ctx,pcVar9,(ulong)(uint)(*(int *)&(pTVar1->name).end - (int)(pTVar1->name).begin));
        OutputContext::Print(ctx->output,"\n",1);
      }
LAB_0015c322:
      uVar10 = uVar10 + 1;
      pEVar5 = ctx->ctx;
    } while (uVar10 < (pEVar5->types).count);
  }
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void TranslateModuleTypeInformation(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Register types");

	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		if(type->isGeneric)
		{
			PrintIndentedLine(ctx, "__nullcTR[%d] = 0; // generic type '%.*s'", i, FMT_ISTR(type->name));
			continue;
		}

		PrintIndent(ctx);
		Print(ctx, "__nullcTR[%d] = __nullcRegisterType(", i);
		Print(ctx, "%uu, ", type->nameHash);
		Print(ctx, "\"%.*s\", ", FMT_ISTR(type->name));
		Print(ctx, "%lld, ", type->size);

		if(TypeArray *typeArray = getType<TypeArray>(type))
		{
			Print(ctx, "__nullcTR[%d], ", typeArray->subType->typeIndex);
			Print(ctx, "%d, NULLC_ARRAY, %d, 0);", (unsigned)typeArray->length, typeArray->alignment);
		}
		else if(TypeUnsizedArray *typeUnsizedArray = getType<TypeUnsizedArray>(type))
		{
			Print(ctx, "__nullcTR[%d], ", typeUnsizedArray->subType->typeIndex);
			Print(ctx, "-1, NULLC_ARRAY, %d, 0);", typeUnsizedArray->alignment);
		}
		else if(TypeRef *typeRef = getType<TypeRef>(type))
		{
			Print(ctx, "__nullcTR[%d], ", typeRef->subType->typeIndex);
			Print(ctx, "1, NULLC_POINTER, %d, 0);", typeRef->alignment);
		}
		else if(TypeFunction *typeFunction = getType<TypeFunction>(type))
		{
			Print(ctx, "__nullcTR[%d], ", typeFunction->returnType->typeIndex);
			Print(ctx, "0, NULLC_FUNCTION, %d, 0);", typeFunction->alignment);
		}
		else if(TypeClass *typeClass = getType<TypeClass>(type))
		{
			unsigned count = 0;

			for(MemberHandle *curr = typeClass->members.head; curr; curr = curr->next)
			{
				if(*curr->variable->name->name.begin == '$')
					continue;

				count++;
			}

			Print(ctx, "__nullcTR[%d], ", typeClass->baseClass ? typeClass->baseClass->typeIndex : 0);
			Print(ctx, "%d, NULLC_CLASS, %d, ", count, typeClass->alignment);

			bool hasFlags = false;

			if(typeClass->hasFinalizer)
			{
				Print(ctx, "NULLC_TYPE_FLAG_HAS_FINALIZER");
				hasFlags = true;
			}

			if(typeClass->extendable)
			{
				Print(ctx, "%sNULLC_TYPE_FLAG_IS_EXTENDABLE", hasFlags ? " | " : "");
				hasFlags = true;
			}

			if(!typeClass->completed)
			{
				Print(ctx, "%sNULLC_TYPE_FLAG_FORWARD_DECLARATION", hasFlags ? " | " : "");
				hasFlags = true;
			}

			if(!hasFlags)
				Print(ctx, "0");

			Print(ctx, ");");
		}
		else if(TypeStruct *typeStruct = getType<TypeStruct>(type))
		{
			unsigned count = 0;

			for(MemberHandle *curr = typeStruct->members.head; curr; curr = curr->next)
			{
				if(*curr->variable->name->name.begin == '$')
					continue;

				count++;
			}

			Print(ctx, "__nullcTR[0], ");
			Print(ctx, "%d, NULLC_CLASS, %d, 0);", count, typeStruct->alignment);
		}
		else
		{
			Print(ctx, "__nullcTR[0], ");
			Print(ctx, "0, NULLC_NONE, %d, 0);", type->alignment);
		}

		PrintLine(ctx);
	}

	PrintLine(ctx);

	PrintIndentedLine(ctx, "// Register type members");

	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		if(type->isGeneric)
			continue;

		if(TypeFunction *typeFunction = getType<TypeFunction>(type))
		{
			PrintIndent(ctx);
			Print(ctx, "__nullcRegisterMembers(__nullcTR[%d], %d", i, typeFunction->arguments.size());

			for(TypeHandle *curr = typeFunction->arguments.head; curr; curr = curr->next)
			{
				Print(ctx, ", __nullcTR[%d]", curr->type->typeIndex);
				Print(ctx, ", 0");
				Print(ctx, ", \"\"");
			}

			Print(ctx, "); // type '%.*s' arguments", FMT_ISTR(type->name));
			PrintLine(ctx);
		}
		else if(TypeStruct *typeStruct = getType<TypeStruct>(type))
		{
			unsigned count = 0;

			for(MemberHandle *curr = typeStruct->members.head; curr; curr = curr->next)
			{
				if(*curr->variable->name->name.begin == '$')
					continue;

				count++;
			}

			PrintIndent(ctx);
			Print(ctx, "__nullcRegisterMembers(__nullcTR[%d], %d", i, count);

			for(MemberHandle *curr = typeStruct->members.head; curr; curr = curr->next)
			{
				if(*curr->variable->name->name.begin == '$')
					continue;

				Print(ctx, ", __nullcTR[%d]", curr->variable->type->typeIndex);
				Print(ctx, ", %d", curr->variable->offset);
				Print(ctx, ", \"%.*s\"", FMT_ISTR(curr->variable->name->name));
			}

			Print(ctx, "); // type '%.*s' members", FMT_ISTR(type->name));
			PrintLine(ctx);
		}
	}

	PrintLine(ctx);
}